

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGame.cpp
# Opt level: O1

void __thiscall BayesianGame::Print(BayesianGame *this)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  
  BayesianGameBase::Print(&this->super_BayesianGameBase);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Utility functions:",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  if ((this->super_BayesianGameBase)._m_nrAgents != 0) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Agent ",6);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      RewardModelDiscreteInterface::Print
                ((RewardModelDiscreteInterface *)
                 ((this->_m_utilFuncs).
                  super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar3));
      bVar1 = uVar4 < (this->super_BayesianGameBase)._m_nrAgents;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

void BayesianGame::Print() const
{
    BayesianGameBase::Print();
    
    cout << "Utility functions:"<<endl;
    for(Index aI = 0; aI < _m_nrAgents; aI++)
    {
        cout << "Agent "<<aI<<":"<<endl;
        _m_utilFuncs[aI].Print();
    }
}